

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# padding_x86_avx.cpp
# Opt level: O2

int __thiscall
ncnn::Padding_x86_avx::forward_int8
          (Padding_x86_avx *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  size_t sVar1;
  undefined8 uVar2;
  void *pvVar3;
  int *piVar4;
  undefined4 uVar5;
  undefined1 uVar6;
  undefined1 uVar8;
  undefined1 uVar10;
  undefined1 uVar12;
  undefined1 uVar13;
  undefined1 uVar14;
  undefined1 uVar16;
  undefined1 uVar18;
  int iVar19;
  ulong uVar20;
  ulong uVar21;
  uint uVar22;
  int iVar23;
  int iVar24;
  uint uVar25;
  long lVar26;
  ulong uVar28;
  ulong uVar29;
  undefined8 *puVar30;
  int iVar31;
  int iVar32;
  undefined8 *puVar33;
  int iVar34;
  long lVar35;
  long lVar36;
  undefined8 *puVar37;
  _func_int *p_Var38;
  int iVar39;
  int iVar40;
  uint uVar41;
  int iVar42;
  int z;
  undefined8 *puVar43;
  ulong uVar44;
  long lVar45;
  ulong uVar46;
  bool bVar47;
  Mat m;
  _func_int **local_c0;
  Mat m_1;
  undefined4 uVar7;
  undefined3 uVar9;
  undefined2 uVar11;
  undefined3 uVar15;
  undefined2 uVar17;
  ulong uVar27;
  
  uVar41 = bottom_blob->c;
  uVar21 = (ulong)uVar41;
  m.elemsize = bottom_blob->elemsize;
  m.elempack = bottom_blob->elempack;
  m.dims = bottom_blob->dims;
  m.w = bottom_blob->w;
  m.h = bottom_blob->h;
  iVar19 = bottom_blob->d;
  m.d = bottom_blob->d;
  m.c = bottom_blob->c;
  if (m.elempack == 8) {
    switch(m.dims) {
    case 1:
      p_Var38 = this->_vptr_Padding_x86_avx[-3];
      uVar41 = *(uint *)(&this->field_0xd8 + (long)p_Var38) + m.w * 8 +
               *(int *)(&this->field_0xdc + (long)p_Var38);
      bVar47 = (uVar41 & 7) == 0;
      if ((bVar47 && (*(uint *)(&this->field_0xd8 + (long)p_Var38) & 7) == 0) &&
         (*(int *)(&this->field_0xe0 + (long)p_Var38) == 0)) {
        Mat::create(top_blob,(int)uVar41 >> 3,(m.elemsize >> 3) << bVar47 * '\x03',8,
                    opt->blob_allocator);
        if (top_blob->data == (void *)0x0) {
          return -100;
        }
        if ((long)top_blob->c * top_blob->cstep == 0) {
          return -100;
        }
        p_Var38 = this->_vptr_Padding_x86_avx[-3];
        uVar21 = (ulong)*(float *)(&this->field_0xe4 + (long)p_Var38);
        padding_constant_pack8_int8_sse
                  (bottom_blob,top_blob,0,0,*(int *)(&this->field_0xd8 + (long)p_Var38) / 8,
                   *(int *)(&this->field_0xdc + (long)p_Var38) / 8,
                   uVar21 << 0x38 | uVar21 << 0x30 | uVar21 << 0x28 |
                   uVar21 << 0x20 | uVar21 << 0x18 | uVar21 << 0x10 | uVar21 << 8 | uVar21);
        return 0;
      }
      break;
    case 2:
      p_Var38 = this->_vptr_Padding_x86_avx[-3];
      uVar41 = *(uint *)(&this->field_0xd0 + (long)p_Var38) + m.h * 8 +
               *(int *)(&this->field_0xd4 + (long)p_Var38);
      bVar47 = (uVar41 & 7) == 0;
      if ((bVar47 && (*(uint *)(&this->field_0xd0 + (long)p_Var38) & 7) == 0) &&
         (*(int *)(&this->field_0xe0 + (long)p_Var38) == 0)) {
        Mat::create(top_blob,m.w + *(int *)(&this->field_0xd8 + (long)p_Var38) +
                             *(int *)(&this->field_0xdc + (long)p_Var38),(int)uVar41 >> 3,
                    (m.elemsize >> 3) << bVar47 * '\x03',8,opt->blob_allocator);
        if (top_blob->data == (void *)0x0) {
          return -100;
        }
        if ((long)top_blob->c * top_blob->cstep == 0) {
          return -100;
        }
        p_Var38 = this->_vptr_Padding_x86_avx[-3];
        uVar21 = (ulong)*(float *)(&this->field_0xe4 + (long)p_Var38);
        padding_constant_pack8_int8_sse
                  (bottom_blob,top_blob,*(int *)(&this->field_0xd0 + (long)p_Var38) / 8,
                   *(int *)(&this->field_0xd4 + (long)p_Var38) / 8,
                   *(int *)(&this->field_0xd8 + (long)p_Var38),
                   *(int *)(&this->field_0xdc + (long)p_Var38),
                   uVar21 << 0x38 | uVar21 << 0x30 | uVar21 << 0x28 |
                   uVar21 << 0x20 | uVar21 << 0x18 | uVar21 << 0x10 | uVar21 << 8 | uVar21);
        return 0;
      }
      break;
    case 3:
      p_Var38 = this->_vptr_Padding_x86_avx[-3];
      uVar25 = *(uint *)(&this->field_0xe8 + (long)p_Var38) + uVar41 * 8 +
               *(int *)(&this->field_0xec + (long)p_Var38);
      bVar47 = (uVar25 & 7) == 0;
      if (bVar47 && (*(uint *)(&this->field_0xe8 + (long)p_Var38) & 7) == 0) {
        if ((uVar25 == uVar41 * 8) || (*(int *)(&this->field_0xe0 + (long)p_Var38) == 0)) {
          uVar25 = (int)uVar25 >> 3;
          Mat::create(top_blob,m.w + *(int *)(&this->field_0xd8 + (long)p_Var38) +
                               *(int *)(&this->field_0xdc + (long)p_Var38),
                      m.h + *(int *)(&this->field_0xd0 + (long)p_Var38) +
                      *(int *)(&this->field_0xd4 + (long)p_Var38),uVar25,
                      (m.elemsize >> 3) << bVar47 * '\x03',8,opt->blob_allocator);
          if (top_blob->data == (void *)0x0) {
            return -100;
          }
          if ((long)top_blob->c * top_blob->cstep == 0) {
            return -100;
          }
          local_c0 = this->_vptr_Padding_x86_avx;
          uVar21 = (long)*(int *)(&this->field_0xe8 + (long)local_c0[-3]) / -8;
          uVar27 = uVar21 & 0xffffffff;
          if ((int)uVar25 < 1) {
            uVar25 = 0;
          }
          for (uVar46 = 0; uVar46 != uVar25; uVar46 = uVar46 + 1) {
            m.w = top_blob->w;
            m.h = top_blob->h;
            pvVar3 = top_blob->data;
            m.elemsize = top_blob->elemsize;
            sVar1 = top_blob->cstep;
            puVar30 = (undefined8 *)(sVar1 * uVar46 * m.elemsize + (long)pvVar3);
            m.elempack = top_blob->elempack;
            m.allocator = top_blob->allocator;
            m.refcount = (int *)0x0;
            m.c = top_blob->d;
            m.d = 1;
            m.dims = top_blob->dims + -1;
            m.cstep = (m.elemsize * (long)m.h * (long)m.w + 0xf & 0xfffffffffffffff0) / m.elemsize;
            if (top_blob->dims == 4) {
              m.cstep = (long)m.h * (long)m.w;
            }
            p_Var38 = local_c0[-3];
            uVar20 = (ulong)*(float *)(&this->field_0xe4 + (long)p_Var38);
            uVar20 = uVar20 << 0x38 | uVar20 << 0x30 | uVar20 << 0x28 |
                     uVar20 << 0x20 | uVar20 << 0x18 | uVar20 << 0x10 | uVar20 << 8 | uVar20;
            uVar22 = (int)uVar21 + (int)uVar46;
            if ((int)uVar22 < 0 || (int)uVar41 <= (int)uVar22) {
              uVar22 = top_blob->d * (int)m.cstep;
              if ((int)uVar22 < 1) {
                uVar22 = 0;
              }
              for (uVar44 = 0; uVar22 != uVar44; uVar44 = uVar44 + 1) {
                *(ulong *)((long)pvVar3 + uVar44 * 8 + sVar1 * m.elemsize * uVar46) = uVar20;
              }
            }
            else {
              iVar19 = bottom_blob->w;
              lVar35 = (long)iVar19;
              iVar24 = bottom_blob->h;
              m_1.c = bottom_blob->d;
              pvVar3 = bottom_blob->data;
              uVar44 = bottom_blob->elemsize;
              sVar1 = bottom_blob->cstep;
              puVar43 = (undefined8 *)(uVar22 * sVar1 * uVar44 + (long)pvVar3);
              m_1.allocator = bottom_blob->allocator;
              m_1.refcount = (int *)0x0;
              m_1.elempack = bottom_blob->elempack;
              m_1.d = 1;
              m_1.dims = bottom_blob->dims + -1;
              m_1.cstep = (uVar44 * iVar24 * lVar35 + 0xf & 0xfffffffffffffff0) / uVar44;
              if (bottom_blob->dims == 4) {
                m_1.cstep = iVar24 * lVar35;
              }
              iVar23 = *(int *)(&this->field_0xe0 + (long)p_Var38);
              m_1.w = iVar19;
              if (iVar23 == 0) {
                m.data = puVar30;
                m_1.data = puVar43;
                m_1.elemsize = uVar44;
                m_1.h = iVar24;
                padding_constant_pack8_int8_sse
                          (&m_1,&m,*(int *)(&this->field_0xd0 + (long)p_Var38),
                           *(int *)(&this->field_0xd4 + (long)p_Var38),
                           *(int *)(&this->field_0xd8 + (long)p_Var38),
                           *(int *)(&this->field_0xdc + (long)p_Var38),uVar20);
                local_c0 = this->_vptr_Padding_x86_avx;
                p_Var38 = local_c0[-3];
                iVar23 = *(int *)(&this->field_0xe0 + (long)p_Var38);
              }
              if (iVar23 == 1) {
                iVar23 = *(int *)(&this->field_0xd4 + (long)p_Var38);
                iVar39 = 0;
                iVar32 = *(int *)(&this->field_0xd8 + (long)p_Var38);
                if (*(int *)(&this->field_0xd8 + (long)p_Var38) < 1) {
                  iVar32 = iVar39;
                }
                iVar42 = 0;
                if (0 < iVar19) {
                  iVar42 = iVar19;
                }
                iVar31 = *(int *)(&this->field_0xdc + (long)p_Var38);
                if (*(int *)(&this->field_0xdc + (long)p_Var38) < 1) {
                  iVar31 = iVar39;
                }
                iVar34 = *(int *)(&this->field_0xd0 + (long)p_Var38);
                if (*(int *)(&this->field_0xd0 + (long)p_Var38) < 1) {
                  iVar34 = 0;
                }
                lVar36 = sVar1 * uVar44 * uVar27;
                puVar33 = puVar30;
                for (; iVar40 = iVar32, iVar39 != iVar34; iVar39 = iVar39 + 1) {
                  while (iVar40 != 0) {
                    *puVar33 = *puVar43;
                    puVar33 = puVar33 + 1;
                    iVar40 = iVar40 + -1;
                  }
                  for (lVar45 = 0; iVar40 = iVar31, iVar42 != (int)lVar45; lVar45 = lVar45 + 1) {
                    *puVar33 = *(undefined8 *)((long)pvVar3 + lVar45 * 8 + lVar36);
                    puVar33 = puVar33 + 1;
                  }
                  while (iVar40 != 0) {
                    *puVar33 = *(undefined8 *)((long)pvVar3 + lVar45 * 8 + lVar36 + -8);
                    puVar33 = puVar33 + 1;
                    iVar40 = iVar40 + -1;
                  }
                }
                iVar42 = 0;
                iVar39 = 0;
                if (0 < m_1.w) {
                  iVar39 = m_1.w;
                }
                puVar37 = puVar43;
                iVar34 = 0;
                if (0 < iVar24) {
                  iVar34 = iVar24;
                }
                for (; iVar40 = iVar32, iVar42 != iVar34; iVar42 = iVar42 + 1) {
                  while (iVar40 != 0) {
                    *puVar33 = *puVar37;
                    puVar33 = puVar33 + 1;
                    iVar40 = iVar40 + -1;
                  }
                  lVar36 = 0;
                  for (lVar45 = 0; iVar39 != (int)lVar45; lVar45 = lVar45 + 1) {
                    puVar33[lVar45] = puVar37[lVar45];
                    lVar36 = lVar36 + -8;
                  }
                  puVar33 = (undefined8 *)((long)puVar33 - lVar36);
                  iVar40 = iVar31;
                  while (bVar47 = iVar40 != 0, iVar40 = iVar40 + -1, bVar47) {
                    *puVar33 = puVar37[lVar45 + -1];
                    puVar33 = puVar33 + 1;
                  }
                  puVar37 = (undefined8 *)((long)puVar37 - lVar36);
                }
                puVar37 = puVar37 + -(long)m_1.w;
                iVar42 = 0;
                if (iVar23 < 1) {
                  iVar23 = 0;
                  iVar42 = 0;
                }
                for (; iVar34 = iVar32, iVar42 != iVar23; iVar42 = iVar42 + 1) {
                  while (iVar34 != 0) {
                    *puVar33 = *puVar37;
                    puVar33 = puVar33 + 1;
                    iVar34 = iVar34 + -1;
                  }
                  for (lVar36 = 0; iVar34 = iVar31, iVar39 != (int)lVar36; lVar36 = lVar36 + 1) {
                    *puVar33 = puVar37[lVar36];
                    puVar33 = puVar33 + 1;
                  }
                  while (iVar34 != 0) {
                    *puVar33 = puVar37[lVar36 + -1];
                    puVar33 = puVar33 + 1;
                    iVar34 = iVar34 + -1;
                  }
                }
                p_Var38 = local_c0[-3];
                iVar23 = *(int *)(&this->field_0xe0 + (long)p_Var38);
              }
              if (iVar23 == 2) {
                iVar23 = *(int *)(&this->field_0xd0 + (long)p_Var38);
                uVar22 = *(uint *)(&this->field_0xd8 + (long)p_Var38);
                lVar36 = (long)(int)uVar22;
                uVar28 = 0;
                uVar20 = 0;
                if (0 < (int)uVar22) {
                  uVar20 = (ulong)uVar22;
                }
                iVar32 = 0;
                if (0 < iVar19) {
                  iVar32 = iVar19;
                }
                uVar29 = (ulong)*(uint *)(&this->field_0xdc + (long)p_Var38);
                if ((int)*(uint *)(&this->field_0xdc + (long)p_Var38) < 1) {
                  uVar29 = uVar28;
                }
                iVar39 = iVar23;
                if (iVar23 < 1) {
                  iVar39 = 0;
                }
                puVar43 = puVar43 + iVar23 * iVar19;
                iVar42 = *(int *)(&this->field_0xd4 + (long)p_Var38);
                lVar45 = (long)pvVar3 +
                         sVar1 * uVar44 * uVar27 + lVar36 * 8 + (long)(iVar23 * iVar19) * 8;
                for (; (int)uVar28 != iVar39; uVar28 = (ulong)((int)uVar28 + 1)) {
                  for (lVar26 = 0; -lVar26 != uVar20; lVar26 = lVar26 + -1) {
                    *puVar30 = *(undefined8 *)(lVar45 + lVar26 * 8);
                    puVar30 = puVar30 + 1;
                  }
                  puVar33 = puVar43;
                  for (iVar23 = 0; iVar23 != iVar32; iVar23 = iVar23 + 1) {
                    uVar2 = *puVar33;
                    puVar33 = puVar33 + 1;
                    *puVar30 = uVar2;
                    puVar30 = puVar30 + 1;
                  }
                  for (lVar26 = 0; -lVar26 != uVar29; lVar26 = lVar26 + -1) {
                    *puVar30 = puVar33[lVar26 + -2];
                    puVar30 = puVar30 + 1;
                  }
                  puVar43 = puVar43 + -lVar35;
                  lVar45 = lVar45 + lVar35 * -8;
                }
                iVar39 = 0;
                iVar23 = 0;
                if (0 < iVar24) {
                  iVar23 = iVar24;
                }
                for (; iVar39 != iVar23; iVar39 = iVar39 + 1) {
                  for (lVar45 = 0; -lVar45 != uVar20; lVar45 = lVar45 + -1) {
                    *puVar30 = puVar43[lVar36 + lVar45];
                    puVar30 = puVar30 + 1;
                  }
                  for (iVar24 = 0; iVar24 != iVar32; iVar24 = iVar24 + 1) {
                    uVar2 = *puVar43;
                    puVar43 = puVar43 + 1;
                    *puVar30 = uVar2;
                    puVar30 = puVar30 + 1;
                  }
                  for (lVar45 = 0; -lVar45 != uVar29; lVar45 = lVar45 + -1) {
                    *puVar30 = puVar43[lVar45 + -2];
                    puVar30 = puVar30 + 1;
                  }
                }
                puVar33 = puVar43 + -(long)(iVar19 * 2);
                iVar24 = 0;
                if (iVar42 < 1) {
                  iVar42 = iVar24;
                }
                puVar43 = puVar43 + (lVar36 - iVar19 * 2);
                for (; iVar24 != iVar42; iVar24 = iVar24 + 1) {
                  for (lVar36 = 0; -lVar36 != uVar20; lVar36 = lVar36 + -1) {
                    *puVar30 = puVar43[lVar36];
                    puVar30 = puVar30 + 1;
                  }
                  puVar37 = puVar33;
                  for (iVar19 = 0; iVar19 != iVar32; iVar19 = iVar19 + 1) {
                    uVar2 = *puVar37;
                    puVar37 = puVar37 + 1;
                    *puVar30 = uVar2;
                    puVar30 = puVar30 + 1;
                  }
                  for (lVar36 = 0; -lVar36 != uVar29; lVar36 = lVar36 + -1) {
                    *puVar30 = puVar37[lVar36 + -2];
                    puVar30 = puVar30 + 1;
                  }
                  puVar33 = puVar33 + -lVar35;
                  puVar43 = puVar43 + -lVar35;
                }
              }
            }
            uVar27 = (ulong)((int)uVar27 + 1);
          }
          return 0;
        }
      }
      break;
    case 4:
      p_Var38 = this->_vptr_Padding_x86_avx[-3];
      if (*(int *)(&this->field_0xe0 + (long)p_Var38) == 0) {
        uVar25 = *(int *)(&this->field_0xe8 + (long)p_Var38) + iVar19 +
                 *(int *)(&this->field_0xec + (long)p_Var38);
        uVar27 = (ulong)uVar25;
        Mat::create(top_blob,m.w + *(int *)(&this->field_0xd8 + (long)p_Var38) +
                             *(int *)(&this->field_0xdc + (long)p_Var38),
                    m.h + *(int *)(&this->field_0xd0 + (long)p_Var38) +
                    *(int *)(&this->field_0xd4 + (long)p_Var38),uVar25,uVar41,m.elemsize,8,
                    opt->blob_allocator);
        if (top_blob->data == (void *)0x0) {
          return -100;
        }
        if ((long)top_blob->c * top_blob->cstep == 0) {
          return -100;
        }
        if ((int)uVar25 < 1) {
          uVar27 = 0;
        }
        if ((int)uVar41 < 1) {
          uVar21 = 0;
        }
        for (uVar46 = 0; uVar46 != uVar21; uVar46 = uVar46 + 1) {
          uVar20 = (ulong)*(float *)(&this->field_0xe4 + (long)this->_vptr_Padding_x86_avx[-3]);
          uVar20 = uVar20 << 0x38 | uVar20 << 0x30 | uVar20 << 0x28 |
                   uVar20 << 0x20 | uVar20 << 0x18 | uVar20 << 0x10 | uVar20 << 8 | uVar20;
          for (uVar44 = 0; uVar44 != uVar27; uVar44 = uVar44 + 1) {
            m.w = top_blob->w;
            m.h = top_blob->h;
            pvVar3 = top_blob->data;
            m.elemsize = top_blob->elemsize;
            lVar35 = top_blob->cstep * uVar46;
            m.elempack = top_blob->elempack;
            m.cstep = (long)m.h * (long)m.w;
            m.data = (void *)((long)pvVar3 + uVar44 * m.elemsize * m.cstep + lVar35 * m.elemsize);
            m.allocator = top_blob->allocator;
            m.refcount = (int *)0x0;
            m.dims = 2;
            m.d = 1;
            m.c = 1;
            p_Var38 = this->_vptr_Padding_x86_avx[-3];
            uVar41 = (int)uVar44 - *(int *)(&this->field_0xe8 + (long)p_Var38);
            if ((int)uVar41 < 0 || iVar19 <= (int)uVar41) {
              uVar28 = m.cstep & 0xffffffff;
              if ((int)m.cstep < 1) {
                uVar28 = 0;
              }
              for (uVar29 = 0; uVar28 != uVar29; uVar29 = uVar29 + 1) {
                *(ulong *)((long)pvVar3 +
                          uVar29 * 8 + m.elemsize * ((long)m.h * uVar44 * (long)m.w + lVar35)) =
                     uVar20;
              }
            }
            else {
              m_1.h = bottom_blob->h;
              m_1.elemsize = bottom_blob->elemsize;
              m_1.allocator = bottom_blob->allocator;
              m_1.cstep = (long)m_1.h * (long)bottom_blob->w;
              m_1.data = (void *)((long)bottom_blob->data +
                                 m_1.cstep * m_1.elemsize * (ulong)uVar41 +
                                 bottom_blob->cstep * uVar46 * m_1.elemsize);
              m_1.refcount = (int *)0x0;
              m_1.elempack = bottom_blob->elempack;
              m_1.w = bottom_blob->w;
              m_1.dims = 2;
              m_1.d = 1;
              m_1.c = 1;
              padding_constant_pack8_int8_sse
                        (&m_1,&m,*(int *)(&this->field_0xd0 + (long)p_Var38),
                         *(int *)(&this->field_0xd4 + (long)p_Var38),
                         *(int *)(&this->field_0xd8 + (long)p_Var38),
                         *(int *)(&this->field_0xdc + (long)p_Var38),uVar20);
            }
          }
        }
        return 0;
      }
    }
  }
  piVar4 = bottom_blob->refcount;
  m.data = bottom_blob->data;
  m.refcount = bottom_blob->refcount;
  m.allocator = bottom_blob->allocator;
  m.cstep = bottom_blob->cstep;
  if (piVar4 != (int *)0x0) {
    LOCK();
    *piVar4 = *piVar4 + 1;
    UNLOCK();
  }
  if (m.elempack != 1) {
    m_1.data = *(void **)opt;
    m_1.elemsize = (size_t)opt->workspace_allocator;
    m_1.elempack = opt->openmp_blocktime;
    m_1._28_1_ = opt->use_winograd_convolution;
    m_1._29_1_ = opt->use_sgemm_convolution;
    m_1._30_1_ = opt->use_int8_inference;
    m_1._31_1_ = opt->use_vulkan_compute;
    m_1.allocator = *(Allocator **)&opt->use_bf16_storage;
    m_1._40_8_ = *(undefined8 *)&opt->use_shader_pack8;
    uVar5 = opt->flush_denormals;
    uVar6 = opt->use_local_pool_allocator;
    uVar8 = opt->use_shader_local_memory;
    uVar10 = opt->use_cooperative_matrix;
    uVar12 = opt->use_winograd23_convolution;
    uVar11 = CONCAT11(uVar12,uVar10);
    uVar9 = CONCAT21(uVar11,uVar8);
    uVar7 = CONCAT31(uVar9,uVar6);
    uVar2._0_1_ = opt->use_winograd43_convolution;
    uVar2._1_1_ = opt->use_winograd63_convolution;
    uVar2._2_1_ = opt->use_reserved_6;
    uVar2._3_1_ = opt->use_reserved_7;
    uVar13 = opt->use_reserved_8;
    uVar14 = opt->use_reserved_9;
    uVar16 = opt->use_reserved_10;
    uVar18 = opt->use_reserved_11;
    uVar17 = CONCAT11(uVar18,uVar16);
    uVar15 = CONCAT21(uVar17,uVar14);
    uVar2._4_4_ = CONCAT31(uVar15,uVar13);
    m_1.c = (int)uVar2;
    m_1.refcount = (int *)opt->workspace_allocator;
    m_1.h = uVar5;
    m_1.d = uVar7;
    m_1._60_4_ = uVar2._4_4_;
    convert_packing(bottom_blob,&m,1,(Option *)&m_1);
  }
  iVar19 = Padding::forward((Padding *)
                            ((long)&this->_vptr_Padding_x86_avx +
                            (long)this->_vptr_Padding_x86_avx[-3]),&m,top_blob,opt);
  if (m.refcount != (int *)0x0) {
    LOCK();
    *m.refcount = *m.refcount + -1;
    UNLOCK();
    if (*m.refcount == 0) {
      if (m.allocator == (Allocator *)0x0) {
        free(m.data);
      }
      else {
        (*(m.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return iVar19;
}

Assistant:

int Padding_x86_avx::forward_int8(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int d = bottom_blob.d;
    int channels = bottom_blob.c;
    int dims = bottom_blob.dims;
    size_t elemsize = bottom_blob.elemsize;
    int elempack = bottom_blob.elempack;

#if __SSE2__
    if (elempack == 8)
    {
        if (dims == 1)
        {
            int outw = w * elempack + left + right;

            int out_elempack = outw % 8 == 0 ? 8 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (left % 8 == 0 && out_elempack == 8 && type == 0)
            {
                top_blob.create(outw / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                int64_t v8 = (int64_t)value;
                int64_t pad_value = v8 | (v8 << 8) | (v8 << 16) | (v8 << 24) | (v8 << 32) | (v8 << 40) | (v8 << 48) | (v8 << 56);
                padding_constant_pack8_int8_sse(bottom_blob, top_blob, 0, 0, left / 8, right / 8, pad_value);

                return 0;
            }
        }

        if (dims == 2)
        {
            int outw = w + left + right;
            int outh = h * elempack + top + bottom;

            int out_elempack = outh % 8 == 0 ? 8 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (top % 8 == 0 && out_elempack == 8 && type == 0)
            {
                top_blob.create(outw, outh / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                int64_t v8 = (int64_t)value;
                int64_t pad_value = v8 | (v8 << 8) | (v8 << 16) | (v8 << 24) | (v8 << 32) | (v8 << 40) | (v8 << 48) | (v8 << 56);
                padding_constant_pack8_int8_sse(bottom_blob, top_blob, top / 8, bottom / 8, left, right, pad_value);

                return 0;
            }
        }

        if (dims == 3)
        {
            int outw = w + left + right;
            int outh = h + top + bottom;
            int outc = channels * elempack + front + behind;

            int out_elempack = outc % 8 == 0 ? 8 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (front % 8 == 0 && out_elempack == 8 && !(outc != channels * elempack && type != 0))
            {
                top_blob.create(outw, outh, outc / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                int front_ = front / elempack;
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < outc / out_elempack; q++)
                {
                    Mat borderm = top_blob.channel(q);

                    // TODO perchannel
                    //                     int64_t pad_value = per_channel_pad_data_size ? vld1_s8(per_channel_pad_data + q * 8) : vdup_n_s8((signed char)value);
                    int64_t v8 = (int64_t)value;
                    int64_t pad_value = v8 | (v8 << 8) | (v8 << 16) | (v8 << 24) | (v8 << 32) | (v8 << 40) | (v8 << 48) | (v8 << 56);

                    //Channel padding
                    if ((q - front_) < 0 || (q - front_) >= channels)
                    {
                        borderm.fill<int64_t>(pad_value);
                    }
                    else
                    {
                        const Mat m = bottom_blob.channel(q - front_);
                        if (type == 0)
                            padding_constant_pack8_int8_sse(m, borderm, top, bottom, left, right, pad_value);
                        if (type == 1)
                            padding_replicate_pack8_int8_sse(m, borderm, top, bottom, left, right);
                        if (type == 2)
                            padding_reflect_pack8_int8_sse(m, borderm, top, bottom, left, right);
                    }
                }

                return 0;
            }
        }

        if (dims == 4)
        {
            int outw = w + left + right;
            int outh = h + top + bottom;
            int outd = d + front + behind;

            if (type == 0)
            {
                top_blob.create(outw, outh, outd, channels, elemsize, elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < channels; q++)
                {
                    // TODO perchannel
                    //                     int64_t pad_value = per_channel_pad_data_size ? vld1_s8(per_channel_pad_data + q * 8) : vdup_n_s8((signed char)value);
                    int64_t v8 = (int64_t)value;
                    int64_t pad_value = v8 | (v8 << 8) | (v8 << 16) | (v8 << 24) | (v8 << 32) | (v8 << 40) | (v8 << 48) | (v8 << 56);

                    for (int z = 0; z < outd; z++)
                    {
                        Mat borderm = top_blob.channel(q).depth(z);

                        // depth padding
                        if ((z - front) < 0 || (z - front) >= d)
                        {
                            borderm.fill<int64_t>(pad_value);
                        }
                        else
                        {
                            const Mat m = bottom_blob.channel(q).depth(z - front);
                            padding_constant_pack8_int8_sse(m, borderm, top, bottom, left, right, pad_value);
                        }
                    }
                }

                return 0;
            }
        }
    }
#endif // __SSE2__

    Mat bottom_blob_unpacked = bottom_blob;
    if (elempack != 1)
    {
        Option opt_pack1 = opt;
        opt_pack1.blob_allocator = opt.workspace_allocator;

        convert_packing(bottom_blob, bottom_blob_unpacked, 1, opt_pack1);
    }

    return Padding::forward(bottom_blob_unpacked, top_blob, opt);
}